

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckFlicker(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  int iVar2;
  AttVal *av_00;
  tmbchar local_48 [8];
  tmbchar ext [20];
  AttVal *av;
  int msgcode;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  BVar1 = Level1_Enabled(doc);
  if (BVar1 != no) {
    av._4_4_ = 0;
    if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_SCRIPT))
    {
      if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_OBJECT)
         ) {
        if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
           (node->tag->id != TidyTag_EMBED)) {
          if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
             (node->tag->id != TidyTag_APPLET)) {
            if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
               (node->tag->id == TidyTag_IMG)) {
              av_00 = prvTidyAttrGetById(node,TidyAttr_SRC);
              BVar1 = hasValue(av_00);
              if (BVar1 != no) {
                GetFileExtension(av_00->value,local_48,0x14);
                iVar2 = prvTidytmbstrcasecmp(local_48,".gif");
                if (iVar2 == 0) {
                  av._4_4_ = 0x2e4;
                }
              }
            }
          }
          else {
            av._4_4_ = 0x2e3;
          }
        }
        else {
          av._4_4_ = 0x2e2;
        }
      }
      else {
        av._4_4_ = 0x2e1;
      }
    }
    else {
      av._4_4_ = 0x2e0;
    }
    if (av._4_4_ != 0) {
      prvTidyReportAccessError(doc,node,av._4_4_);
    }
  }
  return;
}

Assistant:

static void CheckFlicker( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        int msgcode = 0;
        if ( nodeIsSCRIPT(node) )
            msgcode = REMOVE_FLICKER_SCRIPT;
        else if ( nodeIsOBJECT(node) )
            msgcode = REMOVE_FLICKER_OBJECT;
        else if ( nodeIsEMBED(node) )
            msgcode = REMOVE_FLICKER_EMBED;
        else if ( nodeIsAPPLET(node) )
            msgcode = REMOVE_FLICKER_APPLET;

        /* Checks for animated gif within the <img> tag. */
        else if ( nodeIsIMG(node) )
        {
            AttVal* av = attrGetSRC( node );
            if ( hasValue(av) )
            {
                tmbchar ext[20];
                GetFileExtension( av->value, ext, sizeof(ext) );
                if ( TY_(tmbstrcasecmp)(ext, ".gif") == 0 )
                    msgcode = REMOVE_FLICKER_ANIMATED_GIF;
            }
        }            

        if ( msgcode )
            TY_(ReportAccessError)( doc, node, msgcode );
    }
}